

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O2

double permutations(int32_t a,int32_t b)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  allocator<char> local_31;
  double local_30;
  string local_28;
  
  if (b <= a) {
    iVar1 = factorial(a);
    local_30 = (double)iVar1;
    iVar1 = factorial(a - b);
    return local_30 / (double)iVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Permutation formula is: P(a,b) = a! / (a - b)!\nDifference (a - b) in denominator must be greater or equal to zero. Factorial is not defined for negative numbers."
             ,&local_31);
  error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
}

Assistant:

double permutations(int32_t a, int32_t b)
{
	if (a < b)
		error(
			"Permutation formula is: P(a,b) = a! / (a - b)!\nDifference (a - b) in denominator must be greater or equal to zero. Factorial is not defined for negative numbers.");
	return double(factorial(a)) / factorial(a - b);
}